

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_vacuum.cpp
# Opt level: O1

void __thiscall duckdb::LogicalVacuum::Serialize(LogicalVacuum *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"info");
  Serializer::WriteValue<duckdb::VacuumInfo>
            (serializer,
             (this->info).
             super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
             super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
             super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"column_id_map");
  Serializer::
  WriteValue<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>>
            (serializer,&this->column_id_map);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void LogicalVacuum::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);

	serializer.WriteProperty(200, "info", info);
	serializer.WriteProperty(201, "column_id_map", column_id_map);
}